

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O3

Bbr_ImageTree2_t *
Bbr_bddImageStart2(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,DdNode **pbVars
                  ,int fVerbose)

{
  Bbr_ImageTree2_t *pTree;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *n;
  ulong uVar3;
  
  pTree = (Bbr_ImageTree2_t *)malloc(0x20);
  pTree->dd = dd;
  pTree->bImage = (DdNode *)0x0;
  pDVar1 = Bbr_bddComputeCube(dd,dd->vars,dd->size);
  Cudd_Ref(pDVar1);
  pDVar2 = Bbr_bddComputeCube(dd,pbVars,nVars);
  Cudd_Ref(pDVar2);
  n = Cudd_bddExistAbstract(dd,pDVar1,pDVar2);
  pTree->bCube = n;
  Cudd_Ref(n);
  Cudd_RecursiveDeref(dd,pDVar1);
  Cudd_RecursiveDeref(dd,pDVar2);
  pDVar1 = dd->one;
  pTree->bRel = pDVar1;
  Cudd_Ref(pDVar1);
  if (0 < nParts) {
    uVar3 = 0;
    do {
      pDVar2 = Cudd_bddAnd(dd,pDVar1,pbParts[uVar3]);
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(dd,pDVar1);
      uVar3 = uVar3 + 1;
      pDVar1 = pDVar2;
    } while ((uint)nParts != uVar3);
    pTree->bRel = pDVar2;
  }
  Bbr_bddImageCompute2(pTree,bCare);
  return pTree;
}

Assistant:

Bbr_ImageTree2_t * Bbr_bddImageStart2( 
    DdManager * dd, DdNode * bCare,
    int nParts, DdNode ** pbParts,
    int nVars, DdNode ** pbVars, int fVerbose )
{
    Bbr_ImageTree2_t * pTree;
    DdNode * bCubeAll, * bCubeNot, * bTemp;
    int i;

    pTree = ABC_ALLOC( Bbr_ImageTree2_t, 1 );
    pTree->dd = dd;
    pTree->bImage = NULL;

    bCubeAll = Bbr_bddComputeCube( dd, dd->vars, dd->size );      Cudd_Ref( bCubeAll );
    bCubeNot = Bbr_bddComputeCube( dd, pbVars,   nVars );         Cudd_Ref( bCubeNot );
    pTree->bCube = Cudd_bddExistAbstract( dd, bCubeAll, bCubeNot ); Cudd_Ref( pTree->bCube );
    Cudd_RecursiveDeref( dd, bCubeAll );
    Cudd_RecursiveDeref( dd, bCubeNot );

    // derive the monolithic relation
    pTree->bRel = b1;   Cudd_Ref( pTree->bRel );
    for ( i = 0; i < nParts; i++ )
    {
        pTree->bRel = Cudd_bddAnd( dd, bTemp = pTree->bRel, pbParts[i] ); Cudd_Ref( pTree->bRel );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Bbr_bddImageCompute2( pTree, bCare );
    return pTree;
}